

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadIO(xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,char *URL,
                   char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  
  if (ioread == (xmlInputReadCallback)0x0) {
    ioread_local = (xmlInputReadCallback)0x0;
  }
  else {
    xmlInitParser();
    input_00 = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
      ioread_local = (xmlInputReadCallback)0x0;
    }
    else {
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ioread_local = (xmlInputReadCallback)0x0;
      }
      else {
        value = xmlNewIOInputStream(ctxt_00,input_00,XML_CHAR_ENCODING_NONE);
        if (value == (xmlParserInputPtr)0x0) {
          xmlFreeParserInputBuffer(input_00);
          xmlFreeParserCtxt(ctxt_00);
          ioread_local = (xmlInputReadCallback)0x0;
        }
        else {
          inputPush(ctxt_00,value);
          ioread_local = (xmlInputReadCallback)xmlDoRead(ctxt_00,URL,encoding,options,0);
        }
      }
    }
  }
  return (xmlDocPtr)ioread_local;
}

Assistant:

xmlDocPtr
xmlReadIO(xmlInputReadCallback ioread, xmlInputCloseCallback ioclose,
          void *ioctx, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ioread == NULL)
        return (NULL);
    xmlInitParser();

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}